

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordTagger.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::CoreMLModels::WordTagger::MergePartialFromCodedStream
          (WordTagger *this,CodedInputStream *input)

{
  ArenaStringPtr *this_00;
  ArenaStringPtr *this_01;
  ArenaStringPtr *this_02;
  ArenaStringPtr *this_03;
  ArenaStringPtr *this_04;
  ArenaStringPtr *this_05;
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint32 uVar8;
  StringVector *this_06;
  pair<int,_int> pVar9;
  int64 iVar10;
  char *field_name;
  char cVar11;
  ulong uVar12;
  string *psVar13;
  pointer data;
  
  this_00 = &this->modelparameterdata_;
  this_01 = &this->tokenlengthsoutputfeaturename_;
  this_02 = &this->tokenlocationsoutputfeaturename_;
  this_03 = &this->tokentagsoutputfeaturename_;
  this_04 = &this->tokensoutputfeaturename_;
  this_05 = &this->language_;
LAB_00272156:
  pbVar3 = input->buffer_;
  uVar8 = 0;
  if (pbVar3 < input->buffer_end_) {
    bVar2 = *pbVar3;
    uVar12 = (ulong)bVar2;
    pbVar1 = pbVar3 + 1;
    uVar6 = (uint)bVar2;
    if ((char)bVar2 < '\x01') {
      uVar8 = (uint)bVar2;
      if ((input->buffer_end_ <= pbVar1) || (uVar8 = uVar6, (~(uint)*pbVar1 & uVar6) < 0x80))
      goto LAB_0027252e;
      uVar12 = (ulong)((uVar6 + (uint)*pbVar1 * 0x80) - 0x80);
      input->buffer_ = pbVar3 + 2;
    }
    else {
      input->buffer_ = pbVar1;
    }
    uVar12 = uVar12 | 0x100000000;
  }
  else {
LAB_0027252e:
    uVar8 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar8);
    uVar12 = 0;
    if (uVar8 - 1 < 0x3fff) {
      uVar12 = 0x100000000;
    }
    uVar12 = uVar8 | uVar12;
  }
  uVar8 = (uint32)uVar12;
  if ((uVar12 & 0x100000000) == 0) goto LAB_002721b3;
  uVar6 = (uint)(uVar12 >> 3) & 0x1fffffff;
  cVar11 = (char)uVar12;
  if (uVar6 < 0x14) {
    if (uVar6 == 1) {
      if (cVar11 != '\b') goto LAB_002721b3;
      pbVar3 = input->buffer_;
      if (pbVar3 < input->buffer_end_) {
        bVar2 = *pbVar3;
        uVar8 = (uint32)bVar2;
        if (-1 < (char)bVar2) {
          this->revision_ = (uint)bVar2;
          input->buffer_ = pbVar3 + 1;
          goto LAB_00272156;
        }
      }
      else {
        uVar8 = 0;
      }
      iVar10 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar8);
      this->revision_ = (uint32)iVar10;
      if (iVar10 < 0) {
        return false;
      }
      goto LAB_00272156;
    }
    if ((uVar6 == 10) && (cVar11 == 'R')) {
      psVar13 = this_05->ptr_;
      if (psVar13 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_05,(string *)
                           &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        psVar13 = this_05->ptr_;
      }
      bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar13);
      if (!bVar5) {
        return false;
      }
      data = (this_05->ptr_->_M_dataplus)._M_p;
      iVar7 = (int)this_05->ptr_->_M_string_length;
      field_name = "CoreML.Specification.CoreMLModels.WordTagger.language";
      goto LAB_0027244c;
    }
  }
  else {
    switch(uVar6) {
    case 0x14:
      if (cVar11 == -0x5e) {
        psVar13 = this_04->ptr_;
        if (psVar13 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_04,(string *)
                             &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
          psVar13 = this_04->ptr_;
        }
        bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar13);
        if (!bVar5) {
          return false;
        }
        data = (this_04->ptr_->_M_dataplus)._M_p;
        iVar7 = (int)this_04->ptr_->_M_string_length;
        field_name = "CoreML.Specification.CoreMLModels.WordTagger.tokensOutputFeatureName";
LAB_0027244c:
        bVar5 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                          (data,iVar7,PARSE,field_name);
        if (!bVar5) {
          return false;
        }
        goto LAB_00272156;
      }
      break;
    case 0x15:
      if (cVar11 == -0x56) {
        psVar13 = this_03->ptr_;
        if (psVar13 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_03,(string *)
                             &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
          psVar13 = this_03->ptr_;
        }
        bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar13);
        if (!bVar5) {
          return false;
        }
        data = (this_03->ptr_->_M_dataplus)._M_p;
        iVar7 = (int)this_03->ptr_->_M_string_length;
        field_name = "CoreML.Specification.CoreMLModels.WordTagger.tokenTagsOutputFeatureName";
        goto LAB_0027244c;
      }
      break;
    case 0x16:
      if (cVar11 == -0x4e) {
        psVar13 = this_02->ptr_;
        if (psVar13 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_02,(string *)
                             &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
          psVar13 = this_02->ptr_;
        }
        bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar13);
        if (!bVar5) {
          return false;
        }
        data = (this_02->ptr_->_M_dataplus)._M_p;
        iVar7 = (int)this_02->ptr_->_M_string_length;
        field_name = "CoreML.Specification.CoreMLModels.WordTagger.tokenLocationsOutputFeatureName";
        goto LAB_0027244c;
      }
      break;
    case 0x17:
      if (cVar11 == -0x46) {
        psVar13 = this_01->ptr_;
        if (psVar13 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_01,(string *)
                             &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
          psVar13 = this_01->ptr_;
        }
        bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar13);
        if (!bVar5) {
          return false;
        }
        data = (this_01->ptr_->_M_dataplus)._M_p;
        iVar7 = (int)this_01->ptr_->_M_string_length;
        field_name = "CoreML.Specification.CoreMLModels.WordTagger.tokenLengthsOutputFeatureName";
        goto LAB_0027244c;
      }
      break;
    default:
      if (uVar6 == 100) {
        if (cVar11 != '\"') break;
        psVar13 = this_00->ptr_;
        if (psVar13 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_00,(string *)
                             &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
          psVar13 = this_00->ptr_;
        }
        bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar13);
        goto LAB_002721d4;
      }
      if ((uVar6 != 200) || (cVar11 != 'B')) break;
      if (this->_oneof_case_[0] == 200) {
        this_06 = (this->Tags_).stringtags_;
      }
      else {
        this->_oneof_case_[0] = 200;
        this_06 = (StringVector *)operator_new(0x30);
        StringVector::StringVector(this_06);
        (this->Tags_).stringtags_ = this_06;
      }
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < (char)*puVar4)) {
        input->buffer_ = puVar4 + 1;
      }
      else {
        iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar7 < 0) {
          return false;
        }
      }
      pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                        (input,iVar7);
      if ((long)pVar9 < 0) {
        return false;
      }
      bVar5 = StringVector::MergePartialFromCodedStream(this_06,input);
      if (!bVar5) {
        return false;
      }
      bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,pVar9.first);
      if (!bVar5) {
        return false;
      }
      goto LAB_00272156;
    }
  }
LAB_002721b3:
  if (uVar8 == 0) {
    return true;
  }
  if ((uVar8 & 7) == 4) {
    return true;
  }
  bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar8);
LAB_002721d4:
  if (bVar5 == false) {
    return false;
  }
  goto LAB_00272156;
}

Assistant:

bool WordTagger::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.CoreMLModels.WordTagger)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint32 revision = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &revision_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string language = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_language()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->language().data(), this->language().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CoreMLModels.WordTagger.language"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string tokensOutputFeatureName = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_tokensoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->tokensoutputfeaturename().data(), this->tokensoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CoreMLModels.WordTagger.tokensOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string tokenTagsOutputFeatureName = 21;
      case 21: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(170u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_tokentagsoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->tokentagsoutputfeaturename().data(), this->tokentagsoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CoreMLModels.WordTagger.tokenTagsOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string tokenLocationsOutputFeatureName = 22;
      case 22: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(178u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_tokenlocationsoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->tokenlocationsoutputfeaturename().data(), this->tokenlocationsoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CoreMLModels.WordTagger.tokenLocationsOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string tokenLengthsOutputFeatureName = 23;
      case 23: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(186u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_tokenlengthsoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->tokenlengthsoutputfeaturename().data(), this->tokenlengthsoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CoreMLModels.WordTagger.tokenLengthsOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bytes modelParameterData = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadBytes(
                input, this->mutable_modelparameterdata()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.StringVector stringTags = 200;
      case 200: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1602u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_stringtags()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.CoreMLModels.WordTagger)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.CoreMLModels.WordTagger)
  return false;
#undef DO_
}